

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utObjImportExport.cpp
# Opt level: O1

void __thiscall
utObjImportExport_relative_indices_Test_Test::TestBody
          (utObjImportExport_relative_indices_Test_Test *this)

{
  aiMesh *paVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar_4;
  aiFace face;
  aiScene *scene;
  Importer myimporter;
  AssertHelper local_78;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  aiFace local_60;
  uint local_4c;
  AssertHelper local_48;
  aiScene *local_40;
  Importer local_38;
  
  Assimp::Importer::Importer(&local_38);
  pcVar3 = "";
  local_40 = Assimp::Importer::ReadFileFromMemory
                       (&local_38,
                        "v -0.500000 0.000000 0.400000\nv -0.500000 0.000000 -0.800000\nv -0.500000 1.000000 -0.800000\nv -0.500000 1.000000 0.400000\nf -4 -3 -2 -1\nB"
                        ,0x89,0x400,"");
  local_70.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)&local_60,"nullptr","scene",&local_70.ptr_,&local_40);
  if ((char)local_60.mNumIndices == '\0') {
    testing::Message::Message((Message *)&local_70);
    if (local_60.mIndices != (uint *)0x0) {
      pcVar3 = *(char **)local_60.mIndices;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x13e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_70.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_70.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_70.ptr_ + 8))();
      }
      local_70.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_60.mIndices,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_60,"scene->mNumMeshes","1U",&local_40->mNumMeshes,(uint *)&local_70)
  ;
  if ((char)local_60.mNumIndices == '\0') {
    testing::Message::Message((Message *)&local_70);
    if (local_60.mIndices == (uint *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_60.mIndices;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x140,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_70.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_70.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_70.ptr_ + 8))();
      }
      local_70.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_60.mIndices,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  paVar1 = *local_40->mMeshes;
  local_70.ptr_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_60,"mesh->mNumVertices","4U",&paVar1->mNumVertices,(uint *)&local_70
            );
  if ((char)local_60.mNumIndices == '\0') {
    testing::Message::Message((Message *)&local_70);
    if (local_60.mIndices == (uint *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_60.mIndices;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x142,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_70.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_70.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_70.ptr_ + 8))();
      }
      local_70.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_60.mIndices,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_60,"mesh->mNumFaces","1U",&paVar1->mNumFaces,(uint *)&local_70);
  if ((char)local_60.mNumIndices == '\0') {
    testing::Message::Message((Message *)&local_70);
    if (local_60.mIndices == (uint *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_60.mIndices;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x143,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_70.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_70.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_70.ptr_ + 8))();
      }
      local_70.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_60.mIndices,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_60.mNumIndices = 0;
  local_60.mIndices = (uint *)0x0;
  aiFace::operator=(&local_60,paVar1->mFaces);
  local_78.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_70,"face.mNumIndices","4U",&local_60.mNumIndices,(uint *)&local_78);
  if (local_70.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x145,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_78.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_78.data_ + 8))();
      }
      local_78.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_4c = 0;
  if (local_60.mNumIndices != 0) {
    do {
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&local_70,"face.mIndices[i]","i",local_60.mIndices + local_4c,&local_4c
                );
      if (local_70.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_78);
        pcVar3 = "";
        if (local_68.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((local_68.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
                   ,0x148,pcVar3);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (local_78.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_78.data_ + 8))();
          }
          local_78.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_4c = local_4c + 1;
    } while (local_4c < local_60.mNumIndices);
  }
  if (local_60.mIndices != (uint *)0x0) {
    operator_delete__(local_60.mIndices);
  }
  Assimp::Importer::~Importer(&local_38);
  return;
}

Assistant:

TEST_F(utObjImportExport, relative_indices_Test) {
    static const char *ObjModel =
        "v -0.500000 0.000000 0.400000\n"
        "v -0.500000 0.000000 -0.800000\n"
        "v -0.500000 1.000000 -0.800000\n"
        "v -0.500000 1.000000 0.400000\n"
        "f -4 -3 -2 -1\nB";

    Assimp::Importer myimporter;
    const aiScene *scene = myimporter.ReadFileFromMemory(ObjModel, strlen(ObjModel), aiProcess_ValidateDataStructure);
    EXPECT_NE(nullptr, scene);

    EXPECT_EQ(scene->mNumMeshes, 1U);
    const aiMesh *mesh = scene->mMeshes[0];
    EXPECT_EQ(mesh->mNumVertices, 4U);
    EXPECT_EQ(mesh->mNumFaces, 1U);
    const aiFace face = mesh->mFaces[0];
    EXPECT_EQ(face.mNumIndices, 4U);
    for (unsigned int i = 0; i < face.mNumIndices; ++i)
    {
        EXPECT_EQ(face.mIndices[i], i);
    }

}